

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall
InitSocket::SetAddrNotifyCallback
          (InitSocket *this,
          function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
          *fnCbAddrNotify)

{
  pointer ptVar1;
  pointer pcVar2;
  pointer ptVar3;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  _Tuple_impl<1UL,_int,_int> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  thread local_40;
  InitSocket *local_38;
  
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  ::operator=(&this->m_fnCbAddrNotify,fnCbAddrNotify);
  if ((this->m_fnCbAddrNotify).super__Function_base._M_manager != (_Manager_type)0x0) {
    ptVar3 = (this->m_vCurIPAddr).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar1 = (this->m_vCurIPAddr).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ptVar3 != ptVar1) {
      do {
        local_68 = (ptVar3->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                   ).super__Tuple_impl<1UL,_int,_int>;
        pcVar2 = (ptVar3->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                 ).
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p;
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar2,
                   pcVar2 + (ptVar3->
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            ).
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_string_length);
        std::
        function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
        ::operator()(&this->m_fnCbAddrNotify,true,&local_60,
                     local_68.super__Head_base<1UL,_int,_false>._M_head_impl,
                     (int)local_68.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                          _M_head_impl);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        ptVar3 = ptVar3 + 1;
      } while (ptVar3 != ptVar1);
    }
  }
  if ((this->m_thIpChange)._M_id._M_thread == 0) {
    local_68 = (_Tuple_impl<1UL,_int,_int>)IpChangeThread;
    local_60._M_dataplus._M_p = (pointer)0x0;
    local_38 = this;
    std::thread::thread<void(InitSocket::*)(),InitSocket*,void>
              (&local_40,(offset_in_InitSocket_to_subr *)&local_68,&local_38);
    if ((this->m_thIpChange)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->m_thIpChange)._M_id._M_thread = (native_handle_type)local_40._M_id._M_thread;
  }
  return;
}

Assistant:

void InitSocket::SetAddrNotifyCallback(const function<void(bool, const string&, int, int)>& fnCbAddrNotify)
{
    m_fnCbAddrNotify = fnCbAddrNotify;
    if (m_fnCbAddrNotify)
    {   // notify on current ip addresses
        for (auto iter : m_vCurIPAddr)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }

#if defined(_WIN32) || defined(_WIN64)
    if (m_hIFaceNotify == nullptr)
        NotifyIpInterfaceChange(AF_UNSPEC, IpIfaceChanged, this, TRUE, &m_hIFaceNotify);
#else
    if (m_thIpChange.joinable() == false)
        m_thIpChange = thread(&InitSocket::IpChangeThread, this);
#endif
}